

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O3

void mcalcdistress(void)

{
  monst *mtmp;
  uchar uVar1;
  uint uVar2;
  int iVar3;
  
  mtmp = level->monlist;
  do {
    if (mtmp == (monst *)0x0) {
      return;
    }
    if (0 < mtmp->mhp) {
      if (mtmp->data->mmove == '\0') {
        if (vision_full_recalc != '\0') {
          vision_recalc(0);
        }
        iVar3 = minliquid(mtmp);
        if (iVar3 != 0) goto LAB_001e6530;
      }
      mon_regen(mtmp,'\0');
      if (((mtmp->field_0x60 & 0x70) != 0) &&
         (uVar2 = mt_random(),
         (uVar2 * -0x55555555 >> 1 | (uint)((uVar2 * -0x55555555 & 1) != 0) << 0x1f) < 0x2aaaaaab))
      {
        newcham(level,mtmp,(permonst *)0x0,'\0','\0');
      }
      were_change(mtmp);
      if ((mtmp->mblinded != '\0') &&
         (uVar1 = mtmp->mblinded + 0xff, mtmp->mblinded = uVar1, uVar1 == '\0')) {
        mtmp->field_0x62 = mtmp->field_0x62 | 2;
      }
      if ((mtmp->mfrozen != '\0') &&
         (uVar1 = mtmp->mfrozen + 0xff, mtmp->mfrozen = uVar1, uVar1 == '\0')) {
        mtmp->field_0x62 = mtmp->field_0x62 | 4;
      }
      if ((mtmp->mfleetim != '\0') &&
         (uVar1 = mtmp->mfleetim + 0xff, mtmp->mfleetim = uVar1, uVar1 == '\0')) {
        mtmp->field_0x62 = mtmp->field_0x62 & 0xfe;
      }
    }
LAB_001e6530:
    mtmp = mtmp->nmon;
  } while( true );
}

Assistant:

void mcalcdistress(void)
{
    struct monst *mtmp;

    for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
	if (DEADMONSTER(mtmp)) continue;

	/* must check non-moving monsters once/turn in case
	 * they managed to end up in liquid */
	if (mtmp->data->mmove == 0) {
	    if (vision_full_recalc) vision_recalc(0);
	    if (minliquid(mtmp)) continue;
	}

	/* regenerate hit points */
	mon_regen(mtmp, FALSE);

	/* possibly polymorph shapechangers and lycanthropes */
	if (mtmp->cham && !rn2(6))
	    newcham(level, mtmp, NULL, FALSE, FALSE);
	were_change(mtmp);

	/* gradually time out temporary problems */
	if (mtmp->mblinded && !--mtmp->mblinded)
	    mtmp->mcansee = 1;
	if (mtmp->mfrozen && !--mtmp->mfrozen)
	    mtmp->mcanmove = 1;
	if (mtmp->mfleetim && !--mtmp->mfleetim)
	    mtmp->mflee = 0;

	/* FIXME: mtmp->mlstmv ought to be updated here */
    }
}